

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

bool __thiscall
node::CBlockIndexWorkComparator::operator()
          (CBlockIndexWorkComparator *this,CBlockIndex *pa,CBlockIndex *pb)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = base_uint<256U>::CompareTo
                    (&(pa->nChainWork).super_base_uint<256U>,&(pb->nChainWork).super_base_uint<256U>
                    );
  if (iVar3 < 1) {
    iVar3 = base_uint<256U>::CompareTo
                      (&(pa->nChainWork).super_base_uint<256U>,
                       &(pb->nChainWork).super_base_uint<256U>);
    if (iVar3 < 0) {
      bVar2 = true;
      goto LAB_00209948;
    }
    if (pb->nSequenceId <= pa->nSequenceId) {
      bVar2 = pb < pa || pb->nSequenceId < pa->nSequenceId;
      goto LAB_00209948;
    }
  }
  bVar2 = false;
LAB_00209948:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CBlockIndexWorkComparator::operator()(const CBlockIndex* pa, const CBlockIndex* pb) const
{
    // First sort by most total work, ...
    if (pa->nChainWork > pb->nChainWork) return false;
    if (pa->nChainWork < pb->nChainWork) return true;

    // ... then by earliest time received, ...
    if (pa->nSequenceId < pb->nSequenceId) return false;
    if (pa->nSequenceId > pb->nSequenceId) return true;

    // Use pointer address as tie breaker (should only happen with blocks
    // loaded from disk, as those all have id 0).
    if (pa < pb) return false;
    if (pa > pb) return true;

    // Identical blocks.
    return false;
}